

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O3

void __thiscall QWhatsThisAction::QWhatsThisAction(QWhatsThisAction *this,QObject *parent)

{
  undefined4 *puVar1;
  long in_FS_OFFSET;
  code *local_80;
  ImplFn local_78;
  QObject local_70 [8];
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QIcon local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,0x6cf0b0);
  QAction::QAction(&this->super_QAction,(QString *)&local_68,parent);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  *(undefined ***)this = &PTR_metaObject_007ecf20;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)&local_68,button_image);
  QIcon::QIcon(&local_48,(QPixmap *)&local_68);
  QAction::setIcon((QIcon *)this);
  QIcon::~QIcon(&local_48);
  QAction::setCheckable(SUB81(this,0));
  local_80 = actionTriggered;
  local_78 = (ImplFn)0x0;
  local_48.d = (QIconPrivate *)QAction::triggered;
  local_40 = 0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::QCallableObject<void_(QWhatsThisAction::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar1 + 4) = actionTriggered;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)this,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)&local_80,
             (ConnectionType)puVar1,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QKeySequence::QKeySequence
            ((QKeySequence *)&local_48,(QKeyCombination)0x3000030,(QKeyCombination)0x0,
             (QKeyCombination)0x0,(QKeyCombination)0x0);
  QAction::setShortcut((QKeySequence *)this);
  QKeySequence::~QKeySequence((QKeySequence *)&local_48);
  QPixmap::~QPixmap((QPixmap *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWhatsThisAction::QWhatsThisAction(QObject *parent) : QAction(tr("What's This?"), parent)
{
#ifndef QT_NO_IMAGEFORMAT_XPM
    QPixmap p(button_image);
    setIcon(p);
#endif
    setCheckable(true);
    connect(this, &QWhatsThisAction::triggered, this, &QWhatsThisAction::actionTriggered);
#ifndef QT_NO_SHORTCUT
    setShortcut(Qt::ShiftModifier | Qt::Key_F1);
#endif
}